

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

bool __thiscall QMimeBinaryProvider::checkCacheChanged(QMimeBinaryProvider *this)

{
  long lVar1;
  byte bVar2;
  QFileInfo *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  QFileInfo fileInfo;
  undefined4 in_stack_ffffffffffffff98;
  Initialization in_stack_ffffffffffffff9c;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  QFileDevice *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>::
  operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
              *)0x8f8e9d);
  QFileInfo::QFileInfo
            ((QFileInfo *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  QTimeZone::QTimeZone
            ((QTimeZone *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
             in_stack_ffffffffffffff9c);
  QFileInfo::lastModified
            (in_RDI,(QTimeZone *)
                    CONCAT17(in_stack_ffffffffffffffa7,
                             CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  std::
  unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>::
  operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
              *)0x8f8ee7);
  bVar2 = operator>((QDateTime *)
                    CONCAT17(in_stack_ffffffffffffffa7,
                             CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                    (QDateTime *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  QDateTime::~QDateTime((QDateTime *)0x8f8f08);
  QTimeZone::~QTimeZone((QTimeZone *)0x8f8f12);
  bVar3 = (bVar2 & 1) != 0;
  if (bVar3) {
    std::
    unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                  *)0x8f8f2a);
    CacheFile::reload((CacheFile *)
                      CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)))
    ;
  }
  QFileInfo::~QFileInfo((QFileInfo *)0x8f8faa);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QMimeBinaryProvider::checkCacheChanged()
{
    QFileInfo fileInfo(m_cacheFile->file);
    if (fileInfo.lastModified(QTimeZone::UTC) > m_cacheFile->m_mtime) {
        // Deletion can't happen by just running update-mime-database.
        // But the user could use rm -rf :-)
        m_cacheFile->reload(); // will mark itself as invalid on failure
        return true;
    }
    return false;
}